

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall
RegisterGraphTestPathWithCurrentDirectory::RegisterGraphTestPathWithCurrentDirectory
          (RegisterGraphTestPathWithCurrentDirectory *this)

{
  RegisterGraphTestPathWithCurrentDirectory *this_local;
  
  RegisterTest(GraphTestPathWithCurrentDirectory::Create,"GraphTest.PathWithCurrentDirectory");
  return;
}

Assistant:

TEST_F(GraphTest, PathWithCurrentDirectory) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule catdep\n"
"  depfile = $out.d\n"
"  command = cat $in > $out\n"
"build ./out.o: catdep ./foo.cc\n"));
  fs_.Create("foo.cc", "");
  fs_.Create("out.o.d", "out.o: foo.cc\n");
  fs_.Create("out.o", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.o"), &err));
  ASSERT_EQ("", err);

  EXPECT_FALSE(GetNode("out.o")->dirty());
}